

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGTryCompile(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  int iVar1;
  uint uVar2;
  xmlRelaxNGDefinePtr def_00;
  xmlRelaxNGType xVar3;
  
  if (def != (xmlRelaxNGDefinePtr_conflict)0x0) {
    do {
      xVar3 = def->type;
      iVar1 = 0;
      if ((xVar3 | XML_RELAXNG_ONEORMORE) == XML_RELAXNG_START) {
        iVar1 = xmlRelaxNGIsCompilable(def);
        if (((def->dflags & 0x40) != 0) && (def->depth != -0x19)) {
          ctxt->am = (xmlAutomataPtr)0x0;
          iVar1 = xmlRelaxNGCompile(ctxt,def);
          return iVar1;
        }
        xVar3 = def->type;
      }
      uVar2 = xVar3 + XML_RELAXNG_NOT_ALLOWED;
      if (0x15 < uVar2) {
        return iVar1;
      }
      if (uVar2 != 0) {
        if ((0x1007feU >> (uVar2 & 0x1f) & 1) == 0) {
          def_00 = def->content;
          if (def_00 == (xmlRelaxNGDefinePtr)0x0) {
            return iVar1;
          }
          do {
            iVar1 = xmlRelaxNGTryCompile(ctxt,def_00);
            if (iVar1 != 0) {
              return iVar1;
            }
            def_00 = def_00->next;
          } while (def_00 != (xmlRelaxNGDefinePtr)0x0);
        }
        return 0;
      }
      def = def->content;
    } while (def != (xmlRelaxNGDefinePtr)0x0);
  }
  return -1;
}

Assistant:

static int
xmlRelaxNGTryCompile(xmlRelaxNGParserCtxtPtr ctxt, xmlRelaxNGDefinePtr def)
{
    int ret = 0;
    xmlRelaxNGDefinePtr list;

    if ((ctxt == NULL) || (def == NULL))
        return (-1);

    if ((def->type == XML_RELAXNG_START) ||
        (def->type == XML_RELAXNG_ELEMENT)) {
        ret = xmlRelaxNGIsCompilable(def);
        if ((def->dflags & IS_COMPILABLE) && (def->depth != -25)) {
            ctxt->am = NULL;
            ret = xmlRelaxNGCompile(ctxt, def);
#ifdef DEBUG_PROGRESSIVE
            if (ret == 0) {
                if (def->type == XML_RELAXNG_START)
                    xmlGenericError(xmlGenericErrorContext,
                                    "compiled the start\n");
                else
                    xmlGenericError(xmlGenericErrorContext,
                                    "compiled element %s\n", def->name);
            } else {
                if (def->type == XML_RELAXNG_START)
                    xmlGenericError(xmlGenericErrorContext,
                                    "failed to compile the start\n");
                else
                    xmlGenericError(xmlGenericErrorContext,
                                    "failed to compile element %s\n",
                                    def->name);
            }
#endif
            return (ret);
        }
    }
    switch (def->type) {
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGTryCompile(ctxt, def->content);
            break;
        case XML_RELAXNG_TEXT:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_EMPTY:
        case XML_RELAXNG_ELEMENT:
            ret = 0;
            break;
        case XML_RELAXNG_OPTIONAL:
        case XML_RELAXNG_ZEROORMORE:
        case XML_RELAXNG_ONEORMORE:
        case XML_RELAXNG_CHOICE:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_START:
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
            list = def->content;
            while (list != NULL) {
                ret = xmlRelaxNGTryCompile(ctxt, list);
                if (ret != 0)
                    break;
                list = list->next;
            }
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_NOT_ALLOWED:
            ret = 0;
            break;
    }
    return (ret);
}